

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.hpp
# Opt level: O2

bool __thiscall cs::compiler_type::is_left_associative(compiler_type *this,token_base *ptr)

{
  int iVar1;
  size_t sVar2;
  compile_error *pcVar3;
  allocator local_31;
  string local_30;
  
  if (ptr == (token_base *)0x0) {
    pcVar3 = (compile_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_30,"Get the level of null token.",&local_31);
    compile_error::compile_error(pcVar3,&local_30);
    __cxa_throw(pcVar3,&compile_error::typeinfo,compile_error::~compile_error);
  }
  iVar1 = (*ptr->_vptr_token_base[2])(ptr);
  if (iVar1 == 3) {
    local_30._M_dataplus._M_p._0_4_ = *(undefined4 *)&ptr[1]._vptr_token_base;
    sVar2 = phmap::priv::
            raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::signal_types>,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>
            ::count<cs::signal_types>
                      ((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::signal_types>,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>
                        *)signal_left_associative,(key_arg<cs::signal_types> *)&local_30);
    return sVar2 != 0;
  }
  pcVar3 = (compile_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_30,"Get the level of non-signal token.",&local_31);
  compile_error::compile_error(pcVar3,&local_30);
  __cxa_throw(pcVar3,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

bool is_left_associative(token_base *ptr)
		{
			if (ptr == nullptr)
				throw compile_error("Get the level of null token.");
			if (ptr->get_type() != token_types::signal)
				throw compile_error("Get the level of non-signal token.");
			return signal_left_associative.count(static_cast<token_signal *>(ptr)->get_signal()) > 0;
		}